

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O3

void lddmc_unmark_rec(mddnode_t node)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = node->a;
  while( true ) {
    if ((uVar1 & 1) == 0) {
      return;
    }
    uVar2 = uVar1 >> 1 & 0x7fffffffffff;
    node->a = uVar1 & 0xfffffffffffffffe;
    if (1 < uVar2) {
      lddmc_unmark_rec((mddnode_t)(nodes->data + uVar2 * 0x10));
    }
    if (node->b < 0x40000) break;
    uVar1 = node->b >> 0xd & 0xfffffffffffffff0;
    node = (mddnode_t)(nodes->data + uVar1);
    uVar1 = *(ulong *)(nodes->data + uVar1);
  }
  return;
}

Assistant:

static void
lddmc_unmark_rec(mddnode_t node)
{
    if (lddmc_unmark(node)) {
        MDD node_right = mddnode_getright(node);
        if (node_right > lddmc_true) lddmc_unmark_rec(LDD_GETNODE(node_right));
        MDD node_down = mddnode_getdown(node);
        if (node_down > lddmc_true) lddmc_unmark_rec(LDD_GETNODE(node_down));
    }
}